

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

void __thiscall tetgenmesh::outsmesh(tetgenmesh *this,char *smfilename)

{
  memorypool *pmVar1;
  void **ppvVar2;
  double *pdVar3;
  size_t sVar4;
  FILE *__stream;
  void *pvVar5;
  tetgenio *ptVar6;
  bool bVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  tetgenbehavior *ptVar11;
  long lVar12;
  uint uVar13;
  char smefilename [1024];
  char nodfilename [1024];
  char local_838 [1024];
  char local_438 [4];
  undefined2 auStack_434 [514];
  
  if ((smfilename == (char *)0x0) || (*smfilename == '\0')) {
    ptVar11 = this->b;
    if (ptVar11->outfilename[0] == '\0') {
      builtin_strncpy(local_838,"unnamed",8);
    }
    else {
      strcpy(local_838,ptVar11->outfilename);
    }
  }
  else {
    strcpy(local_838,smfilename);
    ptVar11 = this->b;
  }
  strcpy(local_438,local_838);
  sVar4 = strlen(local_838);
  builtin_strncpy(local_838 + sVar4,".smesh",7);
  sVar4 = strlen(local_438);
  builtin_strncpy(local_438 + sVar4,".nod",4);
  *(undefined2 *)((long)auStack_434 + sVar4) = 0x65;
  if (ptVar11->quiet == 0) {
    printf("Writing %s.\n",local_838);
  }
  __stream = fopen(local_838,"w");
  if (__stream == (FILE *)0x0) {
    printf("File I/O Error:  Cannot create file %s.\n",local_838);
  }
  else {
    bVar7 = this->in->firstnumber == 1 && this->b->zeroindex != 0;
    uVar13 = 0;
    fprintf(__stream,"# %s.  TetGen\'s input file.\n",local_838);
    fwrite("\n# part 1: node list.\n",0x16,1,__stream);
    fprintf(__stream,"0  3  0  0  # nodes are found in %s.\n",local_438);
    if (this->b->nobound == 0) {
      uVar13 = 1;
      if (this->in->facetmarkerlist == (int *)0x0) {
        uVar13 = (uint)(this->in->trifacemarkerlist != (int *)0x0);
      }
    }
    fwrite("\n# part 2: facet list.\n",0x17,1,__stream);
    fprintf(__stream,"%ld  %d\n",this->subfaces->items,(ulong)uVar13);
    pmVar1 = this->subfaces;
    ppvVar2 = pmVar1->firstblock;
    pmVar1->pathblock = ppvVar2;
    pmVar1->pathitem =
         (void *)((long)ppvVar2 +
                 (((long)pmVar1->alignbytes + 8U) -
                 (ulong)(ppvVar2 + 1) % (ulong)(long)pmVar1->alignbytes));
    pmVar1->pathitemsleft = pmVar1->itemsperblock;
    while (pvVar5 = memorypool::traverse(pmVar1), pvVar5 != (void *)0x0) {
      if (*(long *)((long)pvVar5 + 0x18) != 0) {
        uVar8 = 0;
        do {
          if ((char)uVar13 != '\0') {
            uVar8 = *(uint *)((long)pvVar5 + (long)this->shmarkindex * 4);
          }
          lVar9 = (long)this->pointmarkindex;
          uVar10 = (uint)bVar7;
          fprintf(__stream,"3    %4d  %4d  %4d",
                  (ulong)(*(int *)(*(long *)((long)pvVar5 + (long)sorgpivot[0] * 8) + lVar9 * 4) -
                         uVar10),
                  (ulong)(*(int *)(*(long *)((long)pvVar5 + (long)sdestpivot[0] * 8) + lVar9 * 4) -
                         uVar10),
                  (ulong)(*(int *)(*(long *)((long)pvVar5 + (long)sapexpivot[0] * 8) + lVar9 * 4) -
                         (uint)bVar7));
          if ((char)uVar13 != '\0') {
            fprintf(__stream,"    %d",(ulong)uVar8);
          }
          fputc(10,__stream);
          pmVar1 = this->subfaces;
          do {
            pvVar5 = memorypool::traverse(pmVar1);
            if (pvVar5 == (void *)0x0) goto LAB_00151036;
          } while (*(long *)((long)pvVar5 + 0x18) == 0);
        } while( true );
      }
    }
LAB_00151036:
    fwrite("\n# part 3: hole list.\n",0x16,1,__stream);
    fprintf(__stream,"%d\n",(ulong)(uint)this->in->numberofholes);
    ptVar6 = this->in;
    if (0 < ptVar6->numberofholes) {
      lVar9 = 0x10;
      lVar12 = 0;
      do {
        pdVar3 = ptVar6->holelist;
        fprintf(__stream,"%d  %g  %g  %g\n",*(undefined8 *)((long)pdVar3 + lVar9 + -0x10),
                *(undefined8 *)((long)pdVar3 + lVar9 + -8),*(undefined8 *)((long)pdVar3 + lVar9),
                (ulong)(uint)(ptVar6->firstnumber + (int)lVar12));
        lVar12 = lVar12 + 1;
        ptVar6 = this->in;
        lVar9 = lVar9 + 0x18;
      } while (lVar12 < ptVar6->numberofholes);
    }
    fwrite("\n# part 4: region list.\n",0x18,1,__stream);
    fprintf(__stream,"%d\n",(ulong)(uint)this->in->numberofregions);
    ptVar6 = this->in;
    if (0 < ptVar6->numberofregions) {
      lVar9 = 0x20;
      lVar12 = 0;
      do {
        pdVar3 = ptVar6->regionlist;
        fprintf(__stream,"%d  %g  %g  %g  %d  %g\n",*(undefined8 *)((long)pdVar3 + lVar9 + -0x20),
                *(undefined8 *)((long)pdVar3 + lVar9 + -0x18),
                *(undefined8 *)((long)pdVar3 + lVar9 + -0x10),*(undefined8 *)((long)pdVar3 + lVar9),
                (ulong)(uint)(ptVar6->firstnumber + (int)lVar12),
                (ulong)(uint)(int)*(double *)((long)pdVar3 + lVar9 + -8));
        lVar12 = lVar12 + 1;
        ptVar6 = this->in;
        lVar9 = lVar9 + 0x28;
      } while (lVar12 < ptVar6->numberofregions);
    }
    fprintf(__stream,"# Generated by %s\n",this->b->commandline);
    fclose(__stream);
  }
  return;
}

Assistant:

void tetgenmesh::outsmesh(char* smfilename)
{
  FILE *outfile;
  char nodfilename[FILENAMESIZE];
  char smefilename[FILENAMESIZE];
  face faceloop;
  point p1, p2, p3;
  int firstindex, shift;
  int bmark;
  int marker;
  int i;

  if (smfilename != (char *) NULL && smfilename[0] != '\0') {
    strcpy(smefilename, smfilename);
  } else if (b->outfilename[0] != '\0') {
    strcpy(smefilename, b->outfilename);
  } else {
    strcpy(smefilename, "unnamed");
  }
  strcpy(nodfilename, smefilename);
  strcat(smefilename, ".smesh");
  strcat(nodfilename, ".node");

  if (!b->quiet) {
    printf("Writing %s.\n", smefilename);
  }
  outfile = fopen(smefilename, "w");
  if (outfile == (FILE *) NULL) {
    printf("File I/O Error:  Cannot create file %s.\n", smefilename);
    return;
  }

  // Determine the first index (0 or 1).
  firstindex = b->zeroindex ? 0 : in->firstnumber;
  shift = 0; // Default no shiftment.
  if ((in->firstnumber == 1) && (firstindex == 0)) {
    shift = 1; // Shift the output indices by 1.
  }

  fprintf(outfile, "# %s.  TetGen's input file.\n", smefilename);
  fprintf(outfile, "\n# part 1: node list.\n");
  fprintf(outfile, "0  3  0  0  # nodes are found in %s.\n", nodfilename);

  marker = 0; // avoid compile warning.
  bmark = !b->nobound && (in->facetmarkerlist || in->trifacemarkerlist);  

  fprintf(outfile, "\n# part 2: facet list.\n");
  // Number of facets, boundary marker.
  fprintf(outfile, "%ld  %d\n", subfaces->items, bmark);
  
  subfaces->traversalinit();
  faceloop.sh = shellfacetraverse(subfaces);
  while (faceloop.sh != (shellface *) NULL) {
    p1 = sorg(faceloop);
    p2 = sdest(faceloop);
    p3 = sapex(faceloop);
    if (bmark) {
      marker = shellmark(faceloop);
    }
    fprintf(outfile, "3    %4d  %4d  %4d", pointmark(p1) - shift,
            pointmark(p2) - shift, pointmark(p3) - shift);
    if (bmark) {
      fprintf(outfile, "    %d", marker);
    }
    fprintf(outfile, "\n");
    faceloop.sh = shellfacetraverse(subfaces);
  }

  // Copy input holelist.
  fprintf(outfile, "\n# part 3: hole list.\n");
  fprintf(outfile, "%d\n", in->numberofholes);
  for (i = 0; i < in->numberofholes; i++) {
    fprintf(outfile, "%d  %g  %g  %g\n", i + in->firstnumber,
            in->holelist[i * 3], in->holelist[i * 3 + 1],
            in->holelist[i * 3 + 2]);
  }

  // Copy input regionlist.
  fprintf(outfile, "\n# part 4: region list.\n");
  fprintf(outfile, "%d\n", in->numberofregions);
  for (i = 0; i < in->numberofregions; i++) {
    fprintf(outfile, "%d  %g  %g  %g  %d  %g\n", i + in->firstnumber,
            in->regionlist[i * 5], in->regionlist[i * 5 + 1],
            in->regionlist[i * 5 + 2], (int) in->regionlist[i * 5 + 3],
            in->regionlist[i * 5 + 4]);
  }

  fprintf(outfile, "# Generated by %s\n", b->commandline);
  fclose(outfile);
}